

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree.cpp
# Opt level: O1

void calculate_factors(int *factors,int num_dims,int *stencil,int stencil_size)

{
  ulong uVar1;
  ulong uVar2;
  int *piVar3;
  
  if (0 < num_dims) {
    uVar1 = 0;
    do {
      factors[uVar1] = 0;
      uVar2 = (ulong)(uint)stencil_size;
      piVar3 = stencil;
      if (0 < stencil_size) {
        do {
          if (*piVar3 != 0) {
            factors[uVar1] = factors[uVar1] + 1;
          }
          piVar3 = piVar3 + (uint)num_dims;
          uVar2 = uVar2 - 1;
        } while (uVar2 != 0);
      }
      uVar1 = uVar1 + 1;
      stencil = stencil + 1;
    } while (uVar1 != (uint)num_dims);
  }
  return;
}

Assistant:

void calculate_factors(int *factors, int num_dims, const int *stencil, int stencil_size) {
    for (int d = 0; d < num_dims; d++) {
        factors[d] = 0;
        for (int i = 0; i < stencil_size; ++i) {

            if (stencil[(i * num_dims) + d] != 0) {
                factors[d]++;
            }
        }
    }
}